

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.cpp
# Opt level: O0

TCHAR * CombinePath(TCHAR *szDirectory,TCHAR *szSubDir)

{
  TCHAR *__dest;
  bool bVar1;
  size_t local_38;
  size_t nLength2;
  size_t nLength1;
  TCHAR *szPathPtr;
  TCHAR *szFullPath;
  TCHAR *szSubDir_local;
  TCHAR *szDirectory_local;
  
  nLength2 = 0;
  local_38 = 0;
  if (szDirectory != (TCHAR *)0x0) {
    nLength2 = strlen(szDirectory);
    while( true ) {
      bVar1 = false;
      if ((nLength2 != 0) && (bVar1 = true, szDirectory[nLength2 - 1] != '\\')) {
        bVar1 = szDirectory[nLength2 - 1] == '/';
      }
      if (!bVar1) break;
      nLength2 = nLength2 - 1;
    }
  }
  szFullPath = szSubDir;
  if (szSubDir != (TCHAR *)0x0) {
    for (; *szFullPath == '/'; szFullPath = szFullPath + 1) {
    }
    local_38 = strlen(szFullPath);
    while( true ) {
      bVar1 = false;
      if (local_38 != 0) {
        bVar1 = szFullPath[local_38 - 1] == '/';
      }
      if (!bVar1) break;
      local_38 = local_38 - 1;
    }
  }
  __dest = (TCHAR *)malloc(nLength2 + local_38 + 2);
  if (__dest != (TCHAR *)0x0) {
    nLength1 = (size_t)__dest;
    if ((szDirectory != (TCHAR *)0x0) && (nLength2 != 0)) {
      memcpy(__dest,szDirectory,nLength2);
      nLength1 = (size_t)(__dest + nLength2);
    }
    if ((szFullPath != (TCHAR *)0x0) && (local_38 != 0)) {
      if (__dest < nLength1) {
        *(undefined1 *)nLength1 = 0x2f;
        nLength1 = nLength1 + 1;
      }
      memcpy((void *)nLength1,szFullPath,local_38);
      nLength1 = local_38 + nLength1;
    }
    *(undefined1 *)nLength1 = 0;
  }
  return __dest;
}

Assistant:

TCHAR * CombinePath(const TCHAR * szDirectory, const TCHAR * szSubDir)
{
    TCHAR * szFullPath = NULL;
    TCHAR * szPathPtr;
    size_t nLength1 = 0;
    size_t nLength2 = 0;

    // Calculate lengths of each part
    if(szDirectory != NULL)
    {
        // Get the length of the directory
        nLength1 = _tcslen(szDirectory);

        // Cut all ending backslashes
        while(nLength1 > 0 && (szDirectory[nLength1 - 1] == _T('\\') || szDirectory[nLength1 - 1] == _T('/')))
            nLength1--;
    }

    if(szSubDir != NULL)
    {
        // Cut all leading backslashes
        while(szSubDir[0] == _T(PATH_SEP_CHAR))
            szSubDir++;

        // Get the length of the subdir
        nLength2 = _tcslen(szSubDir);

        // Cut all ending backslashes
        while(nLength2 > 0 && szSubDir[nLength2 - 1] == _T(PATH_SEP_CHAR))
            nLength2--;
    }

    // Allocate space for the full path
    szFullPath = szPathPtr = CASC_ALLOC(TCHAR, nLength1 + nLength2 + 2);
    if(szFullPath != NULL)
    {
        // Copy the directory
        if(szDirectory != NULL && nLength1 != 0)
        {
            memcpy(szPathPtr, szDirectory, (nLength1 * sizeof(TCHAR)));
            szPathPtr += nLength1;
        }

        // Copy the sub-directory
        if(szSubDir != NULL && nLength2 != 0)
        {
            // Append backslash to the previous one
            if(szPathPtr > szFullPath)
                *szPathPtr++ = _T(PATH_SEP_CHAR);

            // Copy the string
            memcpy(szPathPtr, szSubDir, (nLength2 * sizeof(TCHAR)));
            szPathPtr += nLength2;
        }

        // Terminate the string
        szPathPtr[0] = 0;
    }

    return szFullPath;
}